

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O2

float __thiscall spvtools::opt::analysis::Constant::GetFloat(Constant *this)

{
  uint __line;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *__assertion;
  float fVar2;
  
  iVar1 = (*this->type_->_vptr_Type[0xc])();
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = (*this->type_->_vptr_Type[0xc])();
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 0x24) == 0x20) {
      iVar1 = (*this->_vptr_Constant[0xf])(this);
      if ((FloatConstant *)CONCAT44(extraout_var_01,iVar1) != (FloatConstant *)0x0) {
        fVar2 = FloatConstant::GetFloatValue((FloatConstant *)CONCAT44(extraout_var_01,iVar1));
        return fVar2;
      }
      iVar1 = (*this->_vptr_Constant[0x16])(this);
      if (CONCAT44(extraout_var_02,iVar1) != 0) {
        return 0.0;
      }
      __assertion = "AsNullConstant() && \"Must be a floating point constant.\"";
      __line = 0x1f;
      goto LAB_001c3783;
    }
  }
  __assertion = "type()->AsFloat() != nullptr && type()->AsFloat()->width() == 32";
  __line = 0x1a;
LAB_001c3783:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                ,__line,"float spvtools::opt::analysis::Constant::GetFloat() const");
}

Assistant:

float Constant::GetFloat() const {
  assert(type()->AsFloat() != nullptr && type()->AsFloat()->width() == 32);

  if (const FloatConstant* fc = AsFloatConstant()) {
    return fc->GetFloatValue();
  } else {
    assert(AsNullConstant() && "Must be a floating point constant.");
    return 0.0f;
  }
}